

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

EdgeDescriptorSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *this,size_t index)

{
  reference this_00;
  SyntaxNode *this_01;
  EdgeDescriptorSyntax *pEVar1;
  
  this_00 = nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::
            operator[](&this->elements,index * 2);
  this_01 = TokenOrSyntax::node(this_00);
  pEVar1 = SyntaxNode::as<slang::syntax::EdgeDescriptorSyntax>(this_01);
  return pEVar1;
}

Assistant:

T* operator[](size_t index) {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }